

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inquire.cpp
# Opt level: O2

bool fs_exists(string_view path)

{
  string_view path_00;
  bool bVar1;
  _Bool _Var2;
  string_view path_local;
  error_code ec;
  path local_40;
  
  path_local._M_str = path._M_str;
  path_local._M_len = path._M_len;
  ec._M_value = 0;
  ec._M_cat = (error_category *)std::_V2::system_category();
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_40,&path_local,auto_format);
  bVar1 = std::filesystem::exists(&local_40,&ec);
  if ((!bVar1) || (bVar1 = true, ec._M_value != 0)) {
    _Var2 = fs_is_msvc();
    if (_Var2) {
      path_00._M_str = path_local._M_str;
      path_00._M_len = path_local._M_len;
      bVar1 = fs_is_appexec_alias(path_00);
    }
    else {
      bVar1 = false;
    }
  }
  std::filesystem::__cxx11::path::~path(&local_40);
  return bVar1;
}

Assistant:

bool
fs_exists(std::string_view path)
{
  // fs_exists() is true even if path is non-readable
  // this is like Python pathlib.Path.exists()
  // unlike kwSys:SystemTools:FileExists which uses R_OK instead of F_OK like this project.

  bool ok;
#if defined(HAVE_CXX_FILESYSTEM)
  std::error_code ec;
  ok = (std::filesystem::exists(path, ec) && !ec) ||
        (fs_is_msvc() && fs_is_appexec_alias(path));
#elif defined(_WIN32)
  WIN32_FILE_ATTRIBUTE_DATA fad;
  ok = GetFileAttributesExA(path.data(), GetFileExInfoStandard, &fad);
#else
  // unistd.h
  ok = !access(path.data(), F_OK);
#endif

  return ok;
}